

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_text.cpp
# Opt level: O3

int __thiscall FFont::StringWidth(FFont *this,BYTE *string)

{
  BYTE *pBVar1;
  BYTE BVar2;
  int iVar3;
  int iVar4;
  BYTE *pBVar5;
  int iVar6;
  
  iVar4 = 0;
  iVar6 = 0;
  while( true ) {
    while( true ) {
      BVar2 = *string;
      if (BVar2 != '\x1c') break;
      BVar2 = string[1];
      pBVar5 = string + 1;
      if (BVar2 == '[') {
        BVar2 = '[';
        while ((BVar2 != '\0' && (BVar2 != ']'))) {
          pBVar1 = pBVar5 + 1;
          pBVar5 = pBVar5 + 1;
          BVar2 = *pBVar1;
        }
      }
      string = pBVar5 + (BVar2 != '\0');
    }
    if (BVar2 == '\0') break;
    if (BVar2 == '\n') {
      if (iVar6 < iVar4) {
        iVar6 = iVar4;
      }
      iVar4 = 0;
    }
    else {
      iVar3 = (*this->_vptr_FFont[3])(this);
      iVar4 = iVar3 + iVar4 + this->GlobalKerning;
    }
    string = string + 1;
  }
  if (iVar4 < iVar6) {
    iVar4 = iVar6;
  }
  return iVar4;
}

Assistant:

int FFont::StringWidth (const BYTE *string) const
{
	int w = 0;
	int maxw = 0;
		
	while (*string)
	{
		if (*string == TEXTCOLOR_ESCAPE)
		{
			++string;
			if (*string == '[')
			{
				while (*string != '\0' && *string != ']')
				{
					++string;
				}
			}
			if (*string != '\0')
			{
				++string;
			}
			continue;
		}
		else if (*string == '\n')
		{
			if (w > maxw)
				maxw = w;
			w = 0;
			++string;
		}
		else
		{
			w += GetCharWidth (*string++) + GlobalKerning;
		}
	}
				
	return MAX (maxw, w);
}